

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O3

oonf_layer2_neigh *
dlep_session_get_local_l2_neighbor(dlep_session *session,oonf_layer2_neigh_key *key)

{
  avl_node *paVar1;
  avl_tree *tree;
  avl_node *paVar2;
  char *pcVar3;
  char *pcVar4;
  int line;
  oonf_log_source oVar5;
  oonf_log_severity severity;
  oonf_layer2_neigh_key *key_00;
  oonf_layer2_neigh_key_str nbuf1;
  oonf_layer2_neigh_key_str nbuf2;
  
  paVar1 = avl_find(&session->local_neighbor_tree,key);
  if (paVar1 == (avl_node *)0x0) {
    oVar5 = session->log_source;
    if ((log_global_mask[oVar5] & 2) != 0) {
      pcVar3 = oonf_layer2_neigh_key_to_string(&nbuf1,key,true);
      severity = LOG_SEVERITY_INFO;
      line = 0x204;
      pcVar4 = "Could not find local neighbor for %s";
LAB_00141a83:
      oonf_log(severity,oVar5,"src/generic/dlep/dlep_session.c",line,(void *)0x0,0,pcVar4,pcVar3);
      return (oonf_layer2_neigh *)0x0;
    }
  }
  else {
    pcVar3 = (session->l2_listener).name;
    tree = oonf_layer2_get_net_tree();
    paVar2 = avl_find(tree,pcVar3);
    if (paVar2 == (avl_node *)0x0) {
      oVar5 = session->log_source;
      if ((log_global_mask[oVar5] & 1) != 0) {
        severity = LOG_SEVERITY_DEBUG;
        line = 0x20a;
        pcVar3 = (session->l2_listener).name;
        pcVar4 = "Could not find l2net %s for new neighbor";
        goto LAB_00141a83;
      }
    }
    else {
      key_00 = (oonf_layer2_neigh_key *)((long)&paVar1[-4].key + 2);
      paVar1 = avl_find((avl_tree *)&paVar2[-0x21].key,key_00);
      if (paVar1 != (avl_node *)0x0) {
        return (oonf_layer2_neigh *)&paVar1[-0x16].parent;
      }
      oVar5 = session->log_source;
      if ((log_global_mask[oVar5] & 2) != 0) {
        pcVar3 = oonf_layer2_neigh_key_to_string(&nbuf1,key,true);
        pcVar4 = oonf_layer2_neigh_key_to_string(&nbuf2,key_00,true);
        oonf_log(LOG_SEVERITY_INFO,oVar5,"src/generic/dlep/dlep_session.c",0x213,(void *)0x0,0,
                 "Could not find l2neigh for neighbor %s (%s)",pcVar3,pcVar4);
        return (oonf_layer2_neigh *)0x0;
      }
    }
  }
  return (oonf_layer2_neigh *)0x0;
}

Assistant:

struct oonf_layer2_neigh *
dlep_session_get_local_l2_neighbor(struct dlep_session *session, const struct oonf_layer2_neigh_key *key) {
  struct dlep_local_neighbor *dlep_neigh;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
#ifdef OONF_LOG_INFO
  union oonf_layer2_neigh_key_str nbuf1, nbuf2;
#endif

  dlep_neigh = dlep_session_get_local_neighbor(session, key);
  if (!dlep_neigh) {
    OONF_INFO(session->log_source, "Could not find local neighbor for %s",
              oonf_layer2_neigh_key_to_string(&nbuf1, key, true));
    return NULL;
  }

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    OONF_DEBUG(session->log_source, "Could not find l2net %s for new neighbor", session->l2_listener.name);
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, &dlep_neigh->neigh_key);
  if (!l2neigh) {
    OONF_INFO(session->log_source,
      "Could not find l2neigh for neighbor %s (%s)",
      oonf_layer2_neigh_key_to_string(&nbuf1, key, true),
      oonf_layer2_neigh_key_to_string(&nbuf2, &dlep_neigh->neigh_key, true));
    return NULL;
  }
  return l2neigh;
}